

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountCase::genVertexAttribData
          (VaryingOutputCountCase *this)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar1;
  int iVar2;
  pointer pVVar3;
  uint uVar4;
  
  if (this->m_mode == MODE_WITH_INSTANCING) {
    (this->super_GeometryShaderRenderTest).m_numDrawVertices = 1;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&(this->super_GeometryShaderRenderTest).m_vertexPosData,1);
    pvVar1 = &(this->super_GeometryShaderRenderTest).m_vertexAttrData;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(pvVar1,1);
    pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3->m_data[0] = 0.0;
    pVVar3->m_data[1] = 0.0;
    pVVar3->m_data[2] = 0.0;
    pVVar3->m_data[3] = 1.0;
    if (this->m_test == READ_ATTRIBUTE) {
      iVar2 = this->m_maxEmitCount;
      pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3->m_data[0] = 6.0;
      pVVar3->m_data[1] = 0.0;
      pVVar3->m_data[2] = (float)iVar2;
      pVVar3->m_data[3] = 10.0;
    }
    else {
      pVVar3 = (pvVar1->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3->m_data[0] = 0.0;
      pVVar3->m_data[1] = 0.0;
      pVVar3->m_data[2] = 0.0;
      pVVar3->m_data[3] = 0.0;
    }
  }
  else if (this->m_mode == MODE_WITHOUT_INSTANCING) {
    (this->super_GeometryShaderRenderTest).m_numDrawVertices = 4;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&(this->super_GeometryShaderRenderTest).m_vertexPosData,4);
    pvVar1 = &(this->super_GeometryShaderRenderTest).m_vertexAttrData;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(pvVar1,4);
    pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3->m_data[0] = 0.5;
    pVVar3->m_data[1] = 0.0;
    pVVar3->m_data[2] = 0.0;
    pVVar3->m_data[3] = 1.0;
    pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3[1].m_data[0] = 0.0;
    pVVar3[1].m_data[1] = 0.5;
    pVVar3[1].m_data[2] = 0.0;
    pVVar3[1].m_data[3] = 1.0;
    pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3[2].m_data[0] = -0.7;
    pVVar3[2].m_data[1] = -0.1;
    pVVar3[2].m_data[2] = 0.0;
    pVVar3[2].m_data[3] = 1.0;
    pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexPosData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3[3].m_data[0] = -0.1;
    pVVar3[3].m_data[1] = -0.7;
    pVVar3[3].m_data[2] = 0.0;
    pVVar3[3].m_data[3] = 1.0;
    pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (this->m_test == READ_ATTRIBUTE) {
      pVVar3->m_data[0] = 6.0;
      pVVar3->m_data[1] = 0.0;
      pVVar3->m_data[2] = 0.0;
      pVVar3->m_data[3] = 0.0;
      pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3[1].m_data[0] = 0.0;
      pVVar3[1].m_data[1] = 0.0;
      pVVar3[1].m_data[2] = 0.0;
      pVVar3[1].m_data[3] = 0.0;
      pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3[2].m_data[0] = (float)this->m_maxEmitCount;
      pVVar3[2].m_data[1] = 0.0;
      pVVar3[2].m_data[2] = 0.0;
      pVVar3[2].m_data[3] = 0.0;
      pVVar3 = (this->super_GeometryShaderRenderTest).m_vertexAttrData.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = 0x41200000;
    }
    else {
      pVVar3->m_data[0] = 0.0;
      pVVar3->m_data[1] = 0.0;
      pVVar3->m_data[2] = 0.0;
      pVVar3->m_data[3] = 0.0;
      pVVar3 = (pvVar1->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3[1].m_data[0] = 1.0;
      pVVar3[1].m_data[1] = 0.0;
      pVVar3[1].m_data[2] = 0.0;
      pVVar3[1].m_data[3] = 0.0;
      pVVar3 = (pvVar1->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pVVar3[2].m_data[0] = 2.0;
      pVVar3[2].m_data[1] = 0.0;
      pVVar3[2].m_data[2] = 0.0;
      pVVar3[2].m_data[3] = 0.0;
      pVVar3 = (pvVar1->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = 0x40400000;
    }
    *(undefined1 (*) [16])pVVar3[3].m_data = ZEXT416(uVar4);
  }
  return;
}

Assistant:

void VaryingOutputCountCase::genVertexAttribData (void)
{
	if (m_mode == MODE_WITHOUT_INSTANCING)
		genVertexDataWithoutInstancing();
	else if (m_mode == MODE_WITH_INSTANCING)
		genVertexDataWithInstancing();
	else
		DE_ASSERT(false);
}